

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RemoveSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int flags;
  int iVar1;
  AActor *pAVar2;
  PClassActor *filter;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  AActor *pAVar10;
  char *pcVar11;
  bool bVar12;
  TThinkerIterator<AActor> it;
  FName local_4c;
  FThinkerIterator local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar2 = (AActor *)(param->field_0).field_1.a;
      if (pAVar2 != (AActor *)0x0) {
        if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar4 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
          (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (pAVar2->super_DThinker).super_DObject.Class;
        bVar12 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar12) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar12 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar12) {
          pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e058d;
        }
      }
      if (numparam == 1) {
        pVVar6 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e05ac:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x189a,
                        "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar6 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar11 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003e05ac;
        }
      }
      iVar4 = pVVar6[1].field_0.i;
      if (numparam < 3) {
        pVVar6 = defaultparam->Array;
        if (pVVar6[2].field_0.field_3.Type != '\0') {
          pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003e05cb;
        }
      }
      else {
        pVVar6 = param;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003e05cb:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x189b,
                        "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      flags = pVVar6[2].field_0.i;
      if (numparam < 4) {
        pVVar6 = defaultparam->Array;
        if ((pVVar6[3].field_0.field_3.Type != '\x03') ||
           ((pVVar7 = pVVar6 + 3, pVVar6[3].field_0.field_1.atag != 1 &&
            ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
          pcVar11 = 
          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
          ;
          goto LAB_003e056e;
        }
      }
      else if ((param[3].field_0.field_3.Type != '\x03') ||
              ((pVVar7 = param + 3, param[3].field_0.field_1.atag != 1 &&
               ((pVVar7->field_0).field_1.a != (void *)0x0)))) {
        pcVar11 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
LAB_003e056e:
        __assert_fail(pcVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x189c,
                      "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter = (PClassActor *)(pVVar7->field_0).field_1.a;
      if (numparam < 5) {
        param = defaultparam->Array;
        if (param[4].field_0.field_3.Type == '\0') goto LAB_003e045c;
        pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[4].field_0.field_3.Type == '\0') {
LAB_003e045c:
          iVar1 = param[4].field_0.i;
          FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
          pAVar8 = (pAVar2->master).field_0.p;
          if (pAVar8 != (AActor *)0x0) {
            if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
              pAVar8 = (AActor *)FThinkerIterator::Next(&local_48,false);
              if (pAVar8 != (AActor *)0x0) {
                do {
                  pAVar9 = (pAVar2->master).field_0.p;
                  if ((pAVar9 != (AActor *)0x0) &&
                     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar2->master).field_0.p = (AActor *)0x0;
                    pAVar9 = (AActor *)0x0;
                  }
                  pAVar10 = (pAVar8->master).field_0.p;
                  if ((pAVar10 != (AActor *)0x0) &&
                     (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                    (pAVar8->master).field_0.p = (AActor *)0x0;
                    pAVar10 = (AActor *)0x0;
                  }
                  if ((pAVar8 != pAVar2 && pAVar10 == pAVar9) &&
                     ((pAVar8->health < 1 || (iVar4 != 0)))) {
                    local_4c.Index = iVar1;
                    DoRemove(pAVar8,flags,filter,&local_4c);
                  }
                  pAVar8 = (AActor *)FThinkerIterator::Next(&local_48,false);
                } while (pAVar8 != (AActor *)0x0);
              }
            }
            else {
              (pAVar2->master).field_0.p = (AActor *)0x0;
            }
          }
          return 0;
        }
        pcVar11 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189d,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e058d:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1899,
                "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self && (mo->health <= 0 || removeall))
			{
				DoRemove(mo, flags, filter, species);
			}
		}
	}
	return 0;
}